

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalWrenchesEstimation.cpp
# Opt level: O0

bool iDynTree::computeLinkNetWrenchesWithoutGravity
               (Model *model,LinkVelArray *linkVel,LinkAccArray *linkProperAcc,
               LinkNetTotalWrenchesWithoutGravity *linkNetWrenchesWithoutGravity)

{
  SpatialMomentum *pSVar1;
  long lVar2;
  long lVar3;
  Wrench *this;
  LinkWrenches *in_RCX;
  LinkAccArray *in_RDX;
  LinkVelArray *in_RSI;
  long in_RDI;
  Twist *v;
  SpatialAcc *properAcc;
  SpatialInertia *I;
  LinkConstPtr visitedLink;
  LinkIndex visitedLinkIndex;
  SpatialInertia local_128 [56];
  Twist local_f0 [56];
  Wrench local_b8;
  Wrench local_80;
  SpatialMomentum *local_48;
  undefined8 local_40;
  Twist *local_38;
  undefined8 local_30;
  long local_28;
  LinkWrenches *local_20;
  LinkAccArray *local_18;
  LinkVelArray *local_10;
  long local_8;
  
  local_28 = 0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while( true ) {
    lVar2 = local_28;
    lVar3 = iDynTree::Model::getNrOfLinks();
    if (lVar3 <= lVar2) break;
    local_30 = iDynTree::Model::getLink(local_8);
    local_38 = (Twist *)iDynTree::Link::getInertia();
    local_40 = iDynTree::LinkAccArray::operator()(local_18,local_28);
    local_48 = (SpatialMomentum *)iDynTree::LinkVelArray::operator()(local_10,local_28);
    iDynTree::SpatialInertia::operator*((SpatialInertia *)&local_b8,(SpatialAcc *)local_38);
    pSVar1 = local_48;
    iDynTree::SpatialInertia::operator*(local_128,local_38);
    iDynTree::Twist::operator*(local_f0,pSVar1);
    iDynTree::Wrench::operator+(&local_80,&local_b8);
    this = (Wrench *)iDynTree::LinkWrenches::operator()(local_20,local_28);
    iDynTree::Wrench::operator=(this,&local_80);
    Wrench::~Wrench((Wrench *)0x547927);
    Wrench::~Wrench((Wrench *)0x547931);
    SpatialMomentum::~SpatialMomentum((SpatialMomentum *)0x54793b);
    Wrench::~Wrench((Wrench *)0x547948);
    local_28 = local_28 + 1;
  }
  return true;
}

Assistant:

bool computeLinkNetWrenchesWithoutGravity(const Model& model,
                                          const LinkVelArray& linkVel,
                                          const LinkAccArray& linkProperAcc,
                                                LinkNetTotalWrenchesWithoutGravity& linkNetWrenchesWithoutGravity)
{
     // Note that we are not using a Traversal here: the main reason
     // is that given that the computation that we are doing (once we have the linkVel and linkProperAcc
     // does not depend on the topology, so we can visit the links in any possible order
     for(LinkIndex visitedLinkIndex = 0; visitedLinkIndex < static_cast<LinkIndex>(model.getNrOfLinks()); visitedLinkIndex++)
     {
         LinkConstPtr visitedLink = model.getLink(visitedLinkIndex);

         const iDynTree::SpatialInertia & I = visitedLink->getInertia();
         const iDynTree::SpatialAcc     & properAcc = linkProperAcc(visitedLinkIndex);
         const iDynTree::Twist          & v = linkVel(visitedLinkIndex);
         linkNetWrenchesWithoutGravity(visitedLinkIndex) = I*properAcc + v*(I*v);
     }

     return true;
}